

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  char *ctx;
  undefined1 local_30 [8];
  SYSTEM system;
  
  SYSTEM::SYSTEM((SYSTEM *)local_30);
  ctx = "F:/learn_field/mysim/build/simple_test.elf";
  SYSTEM::load_code((SYSTEM *)local_30,"F:/learn_field/mysim/build/simple_test.elf",
                    (uchar *)((long)&(system.bus_p)->rom_p + 4));
  SYSTEM::init((SYSTEM *)local_30,(EVP_PKEY_CTX *)ctx);
  SYSTEM::run((SYSTEM *)local_30);
  SYSTEM::~SYSTEM((SYSTEM *)local_30);
  return 0;
}

Assistant:

int main()
{
	//init_config();

	//sim_init();

	char * filename = "F:/learn_field/mysim/build/simple_test.elf";
	//char * filename = "hello.elf";
	SYSTEM system;
	system.load_code(filename, system.ram_p->mem);

	system.init();
	system.run();
	// exec_main();
}